

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

int max_mon_load(monst *mtmp)

{
  ulong local_18;
  long maxload;
  monst *mtmp_local;
  
  if (mtmp->data->cwt == 0) {
    local_18 = ((ulong)mtmp->data->msize * 1000) / 2;
  }
  else if (((mtmp->data->mflags2 & 0x4000000) == 0) ||
          (((mtmp->data->mflags2 & 0x4000000) != 0 && (0x5aa < mtmp->data->cwt)))) {
    local_18 = ((ulong)mtmp->data->cwt * 1000) / 0x5aa;
  }
  else {
    local_18 = 1000;
  }
  if ((mtmp->data->mflags2 & 0x4000000) == 0) {
    local_18 = local_18 / 2;
  }
  if (local_18 == 0) {
    local_18._0_4_ = 1;
  }
  return (int)local_18;
}

Assistant:

int max_mon_load(struct monst *mtmp)
{
	long maxload;

	/* Base monster carrying capacity is equal to human maximum
	 * carrying capacity, or half human maximum if not strong.
	 * (for a polymorphed player, the value used would be the
	 * non-polymorphed carrying capacity instead of max/half max).
	 * This is then modified by the ratio between the monster weights
	 * and human weights.  Corpseless monsters are given a capacity
	 * proportional to their size instead of weight.
	 */
	if (!mtmp->data->cwt)
		maxload = (MAX_CARR_CAP * (long)mtmp->data->msize) / MZ_HUMAN;
	else if (!strongmonst(mtmp->data)
		|| (strongmonst(mtmp->data) && (mtmp->data->cwt > WT_HUMAN)))
		maxload = (MAX_CARR_CAP * (long)mtmp->data->cwt) / WT_HUMAN;
	else	maxload = MAX_CARR_CAP; /*strong monsters w/cwt <= WT_HUMAN*/

	if (!strongmonst(mtmp->data)) maxload /= 2;

	if (maxload < 1) maxload = 1;

	return (int) maxload;
}